

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer.cc
# Opt level: O0

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  reference pvVar6;
  const_reference pvVar7;
  Parameters *pPVar8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *pvVar9;
  RNNBuilder *pRVar10;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 extraout_RDX;
  ComputationGraph *in_RDI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_R8;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 extraout_var [56];
  Expression EVar13;
  double *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  byte in_stack_00000020;
  int k_1;
  int bestk_1;
  double best_1;
  vector<float,_std::allocator<float>_> dist_1;
  Expression i_l_1;
  Expression i_lh_1;
  Expression combine_h_1;
  Expression alpha_1;
  Expression input_cols_1;
  uint att_1;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i_1;
  Expression i_att_oh_1;
  Expression oh_1;
  int j_4;
  int k;
  int bestk;
  double best;
  vector<float,_std::allocator<float>_> dist;
  Expression i_l;
  Expression i_lh;
  Expression combine_h;
  Expression alpha;
  Expression input_cols;
  uint att;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  Expression i_att_oh;
  Expression oh;
  int j_3;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  int i_2;
  uint i_1;
  uint j_2;
  int j_1;
  uint j;
  uint i;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  Expression i_lh2l;
  Expression i_lhbias;
  Expression i_oh2lh;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExp2xExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_charpadding1;
  Expression i_charpadding2;
  Expression i_charpadding_1;
  Expression i_charpadding_2;
  Expression i_wordpadding1;
  Expression i_wordpadding2;
  Expression i_wordpadding_1;
  Expression i_wordpadding_2;
  uint slen;
  ComputationGraph *in_stack_ffffffffffffe7e8;
  RNNBuilder *in_stack_ffffffffffffe7f0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffe7f8;
  Parameters *in_stack_ffffffffffffe800;
  Tensor *in_stack_ffffffffffffe808;
  Dim *in_stack_ffffffffffffe810;
  undefined1 *in_stack_ffffffffffffe818;
  undefined4 in_stack_ffffffffffffe820;
  real in_stack_ffffffffffffe824;
  undefined4 uVar14;
  Expression *y;
  Tensor *in_stack_ffffffffffffe828;
  int local_129c;
  int local_1278;
  int local_1274;
  double local_1270;
  vector<float,_std::allocator<float>_> local_1268;
  undefined1 local_1240 [48];
  undefined1 *local_1210;
  undefined8 local_1208;
  expr local_11f0 [32];
  undefined1 local_11d0 [40];
  float *local_11a8;
  expr local_10f0 [32];
  uint local_10d0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_10c8;
  Expression local_10b0;
  uint local_109c;
  uint *local_1098;
  undefined8 local_1090;
  Dim local_1060;
  int local_1038;
  int local_1034;
  double local_1030;
  vector<float,_std::allocator<float>_> local_1028;
  undefined1 local_1000 [48];
  undefined1 *local_fd0;
  undefined8 local_fc8;
  expr local_fb0 [32];
  undefined1 local_f90 [32];
  undefined1 *local_f70;
  undefined8 local_f68;
  expr local_eb0 [32];
  uint local_e90;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_e88;
  uint local_e5c;
  uint *local_e58;
  undefined8 local_e50;
  int local_e0c;
  undefined1 local_e08 [16];
  undefined8 local_df8;
  uint local_dec;
  undefined1 local_de8 [32];
  undefined1 *local_dc8;
  undefined8 local_dc0;
  uint local_da4;
  uint local_d8c;
  uint local_d74;
  undefined1 local_d70 [80];
  undefined1 *local_d20;
  undefined8 local_d18;
  undefined1 local_d00 [80];
  undefined1 *local_cb0;
  undefined8 local_ca8;
  undefined1 local_c90 [80];
  undefined1 *local_c40;
  undefined8 local_c38;
  undefined1 local_c20 [80];
  undefined1 *local_bd0;
  undefined8 local_bc8;
  undefined1 local_bb0 [80];
  undefined1 *local_b60;
  undefined8 local_b58;
  undefined1 local_b40 [80];
  undefined1 *local_af0;
  undefined8 local_ae8;
  undefined1 local_ad0 [80];
  undefined1 *local_a80;
  undefined8 local_a78;
  undefined1 local_a60 [80];
  undefined1 *local_a10;
  undefined8 local_a08;
  undefined1 local_9f0 [80];
  undefined1 *local_9a0;
  undefined8 local_998;
  uint local_97c;
  undefined1 local_978 [32];
  undefined1 *local_958;
  undefined8 local_950;
  uint local_934;
  uint local_8fc;
  expr local_8d8 [16];
  undefined1 local_8c8 [80];
  undefined1 *local_878;
  undefined8 local_870;
  expr local_858 [16];
  undefined1 local_848 [48];
  undefined1 *local_818;
  undefined8 local_810;
  expr local_7f8 [16];
  undefined1 local_7e8 [80];
  undefined1 *local_798;
  undefined8 local_790;
  undefined1 local_778 [80];
  undefined1 *local_728;
  undefined8 local_720;
  undefined1 local_708 [80];
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined1 local_698 [80];
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_628 [80];
  undefined1 *local_5d8;
  undefined8 local_5d0;
  undefined1 local_5b8 [80];
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_548 [80];
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined1 local_4d8 [80];
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_468 [80];
  undefined1 *local_418;
  undefined8 local_410;
  int local_3f4;
  uint local_3cc;
  uint local_3a4;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_380;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_360;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_340;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_320;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_300;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2e0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_2c0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2a0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_280;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_260;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_240;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_220;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_200;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_1e0 [14];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 local_58 [16];
  undefined8 local_48;
  uint local_38;
  byte local_31;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_28;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_31 = in_stack_00000020 & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_38 = (uint)sVar2;
  cnn::RNNBuilder::new_graph(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x38dd18);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe800);
  cnn::RNNBuilder::new_graph(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x38dd8e);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  cnn::expr::parameter((ComputationGraph *)in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e07c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e0a8);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e0cc);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e0f8);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e11c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e148);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e16c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e198);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e1bc);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e1e8);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e20c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e238);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e25c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e288);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
             *)0x38e2ac);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
           (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>::
  ~allocator((allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
              *)0x38e2d8);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e2fc);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e328);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e34c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e378);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e39c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e3c8);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e3ec);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e418);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e43c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e468);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x38e48c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
             (allocator_type *)in_stack_ffffffffffffe800);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x38e4b8);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x38e4c5);
  for (local_3a4 = 0; local_3a4 < local_38; local_3a4 = local_3a4 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)local_3a4);
    cnn::expr::lookup((ComputationGraph *)in_stack_ffffffffffffe808,
                      (LookupParameters *)in_stack_ffffffffffffe800,
                      (uint)((ulong)in_stack_ffffffffffffe7f8 >> 0x20));
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_1e0,(ulong)local_3a4);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    if ((::eval & 1U) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_1e0,(ulong)local_3a4);
      auVar12 = ZEXT464((uint)pdrop);
      cnn::expr::dropout((Expression *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe824);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_1e0,(ulong)local_3a4);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_200,(ulong)local_3a4);
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](local_20,(ulong)local_3a4);
    std::vector<int,_std::allocator<int>_>::size(pvVar3);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    local_3cc = 0;
    while( true ) {
      uVar5 = (ulong)local_3cc;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](local_20,(ulong)local_3a4);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar2 <= uVar5) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](local_20,(ulong)local_3a4);
      std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_3cc);
      cnn::expr::lookup((ComputationGraph *)in_stack_ffffffffffffe808,
                        (LookupParameters *)in_stack_ffffffffffffe800,
                        (uint)((ulong)in_stack_ffffffffffffe7f8 >> 0x20));
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_200,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(ulong)local_3cc);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      if ((::eval & 1U) == 0) {
        pvVar4 = std::
                 vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ::operator[](&local_200,(ulong)local_3a4);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (pvVar4,(ulong)local_3cc);
        auVar12 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((Expression *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe824);
        pvVar4 = std::
                 vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ::operator[](&local_200,(ulong)local_3a4);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (pvVar4,(ulong)local_3cc);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      }
      local_3cc = local_3cc + 1;
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_220,(ulong)local_3a4);
    pvVar4 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[](&local_200,(ulong)local_3a4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(pvVar4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_240,(ulong)local_3a4);
    pvVar4 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[](&local_200,(ulong)local_3a4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(pvVar4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_260,(ulong)local_3a4);
    pvVar4 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[](&local_200,(ulong)local_3a4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(pvVar4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_280,(ulong)local_3a4);
    pvVar4 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[](&local_200,(ulong)local_3a4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(pvVar4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    local_3f4 = 0;
    while( true ) {
      uVar5 = (ulong)local_3f4;
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_200,(ulong)local_3a4);
      sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                        (pvVar4);
      dVar11 = auVar12._0_8_;
      if (sVar2 <= uVar5) break;
      if (local_3f4 + -1 < 0) {
        iVar1 = local_3f4 + 1;
        pvVar4 = std::
                 vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ::operator[](&local_200,(ulong)local_3a4);
        sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                          (pvVar4);
        if ((ulong)(long)iVar1 < sVar2) {
          iVar1 = local_3f4 + 2;
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                            (pvVar4);
          if ((ulong)(long)iVar1 < sVar2) {
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 2));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_4f0 = 5;
            local_4f8 = local_548;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
          else {
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_480 = 5;
            local_488 = local_4d8;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
        }
        else {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_410 = 5;
          local_418 = local_468;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_220,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
      }
      else if (local_3f4 + -2 < 0) {
        iVar1 = local_3f4 + 1;
        pvVar4 = std::
                 vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ::operator[](&local_200,(ulong)local_3a4);
        sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                          (pvVar4);
        if ((ulong)(long)iVar1 < sVar2) {
          iVar1 = local_3f4 + 2;
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                            (pvVar4);
          if ((ulong)(long)iVar1 < sVar2) {
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 2));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_640 = 5;
            local_648 = local_698;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
          else {
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_5d0 = 5;
            local_5d8 = local_628;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
        }
        else {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)(local_3f4 + -1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_560 = 5;
          local_568 = local_5b8;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_220,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
      }
      else {
        iVar1 = local_3f4 + 1;
        pvVar4 = std::
                 vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ::operator[](&local_200,(ulong)local_3a4);
        sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                          (pvVar4);
        if ((ulong)(long)iVar1 < sVar2) {
          iVar1 = local_3f4 + 2;
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                            (pvVar4);
          if ((ulong)(long)iVar1 < sVar2) {
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -2));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 2));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_790 = 5;
            local_798 = local_7e8;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
          else {
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -2));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + -1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_200,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)(local_3f4 + 1));
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            cnn::expr::Expression::Expression
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
            local_720 = 5;
            local_728 = local_778;
            cnn::expr::concatenate
                      ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
            pvVar4 = std::
                     vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ::operator[](&local_220,(ulong)local_3a4);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                      (pvVar4,(long)local_3f4);
            cnn::expr::Expression::operator=
                      ((Expression *)in_stack_ffffffffffffe7f0,
                       (Expression *)in_stack_ffffffffffffe7e8);
          }
        }
        else {
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)(local_3f4 + -2));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)(local_3f4 + -1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_200,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_6b0 = 5;
          local_6b8 = local_708;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          pvVar4 = std::
                   vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ::operator[](&local_220,(ulong)local_3a4);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (pvVar4,(long)local_3f4);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
      }
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_220,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      local_810 = 3;
      local_818 = local_848;
      cnn::expr::affine_transform
                ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
      dVar11 = cnn::expr::tanh(local_7f8,dVar11);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_240,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_240,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_1e0,(ulong)local_3a4);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      local_870 = 5;
      local_878 = local_8c8;
      cnn::expr::affine_transform
                ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
      dVar11 = cnn::expr::tanh(local_858,dVar11);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_260,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_260,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::operator*
                ((Expression *)in_stack_ffffffffffffe828,
                 (Expression *)CONCAT44(in_stack_ffffffffffffe824,in_stack_ffffffffffffe820));
      auVar12._0_8_ = cnn::expr::exp(local_8d8,dVar11);
      auVar12._8_56_ = extraout_var;
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_280,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(long)local_3f4);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      local_3f4 = local_3f4 + 1;
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_280,(ulong)local_3a4);
    cnn::expr::sum<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_2a0,(ulong)local_3a4);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_2c0,(ulong)local_3a4);
    pvVar4 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[](&local_200,(ulong)local_3a4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(pvVar4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808);
    local_8fc = 0;
    while( true ) {
      uVar5 = (ulong)local_8fc;
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_200,(ulong)local_3a4);
      sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                        (pvVar4);
      if (sVar2 <= uVar5) break;
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_240,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(ulong)local_8fc);
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_280,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(ulong)local_8fc);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (&local_2a0,(ulong)local_3a4);
      cnn::expr::cdiv((Expression *)in_stack_ffffffffffffe828,
                      (Expression *)CONCAT44(in_stack_ffffffffffffe824,in_stack_ffffffffffffe820));
      cnn::expr::cwise_multiply
                ((Expression *)in_stack_ffffffffffffe828,
                 (Expression *)CONCAT44(in_stack_ffffffffffffe824,in_stack_ffffffffffffe820));
      pvVar4 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[](&local_2c0,(ulong)local_3a4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar4,(ulong)local_8fc);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      local_8fc = local_8fc + 1;
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[](&local_2c0,(ulong)local_3a4);
    cnn::expr::sum<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_2e0,(ulong)local_3a4);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
  }
  for (local_934 = 0; local_934 < local_38; local_934 = local_934 + 1) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_2e0,(ulong)local_934);
    cnn::expr::Expression::Expression
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_1e0,(ulong)local_934);
    cnn::expr::Expression::Expression
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    local_950 = 2;
    local_958 = local_978;
    cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_300,(ulong)local_934);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
  }
  for (local_97c = 0; local_97c < local_38; local_97c = local_97c + 1) {
    if ((int)(local_97c - 1) < 0) {
      if (local_97c + 1 < local_38) {
        if (local_97c + 2 < local_38) {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)local_97c);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 2));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_a78 = 5;
          local_a80 = local_ad0;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_320,(long)(int)local_97c);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
        else {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)local_97c);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_a08 = 5;
          local_a10 = local_a60;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_320,(long)(int)local_97c);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
      }
      else {
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)local_97c);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_998 = 5;
        local_9a0 = local_9f0;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_320,(long)(int)local_97c);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      }
    }
    else if ((int)(local_97c - 2) < 0) {
      if (local_97c + 1 < local_38) {
        if (local_97c + 2 < local_38) {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c - 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)local_97c);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 2));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_bc8 = 5;
          local_bd0 = local_c20;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_320,(long)(int)local_97c);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
        else {
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c - 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)local_97c);
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_300,(long)(int)(local_97c + 1));
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          cnn::expr::Expression::Expression
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
          local_b58 = 5;
          local_b60 = local_bb0;
          cnn::expr::concatenate
                    ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_320,(long)(int)local_97c);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
      }
      else {
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c - 1));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)local_97c);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_ae8 = 5;
        local_af0 = local_b40;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_320,(long)(int)local_97c);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      }
    }
    else if (local_97c + 1 < local_38) {
      if (local_97c + 2 < local_38) {
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c - 2));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c - 1));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)local_97c);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c + 1));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c + 2));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_d18 = 5;
        local_d20 = local_d70;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_320,(long)(int)local_97c);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      }
      else {
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c - 2));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c - 1));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)local_97c);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_300,(long)(int)(local_97c + 1));
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_ca8 = 5;
        local_cb0 = local_d00;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_320,(long)(int)local_97c);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      }
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (&local_300,(long)(int)(local_97c - 2));
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (&local_300,(long)(int)(local_97c - 1));
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (&local_300,(long)(int)local_97c);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      cnn::expr::Expression::Expression
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
      local_c38 = 5;
      local_c40 = local_c90;
      cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (&local_320,(long)(int)local_97c);
      cnn::expr::Expression::operator=
                ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    }
  }
  for (local_d74 = 0; local_d74 < local_38; local_d74 = local_d74 + 1) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_320,(ulong)local_d74);
    cnn::RNNBuilder::add_input
              ((RNNBuilder *)in_stack_ffffffffffffe808,(Expression *)in_stack_ffffffffffffe800);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_340,(ulong)local_d74);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
  }
  for (local_d8c = 0; local_d8c < local_38; local_d8c = local_d8c + 1) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_320,(ulong)(~local_d8c + local_38));
    cnn::RNNBuilder::add_input
              ((RNNBuilder *)in_stack_ffffffffffffe808,(Expression *)in_stack_ffffffffffffe800);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_360,(ulong)((local_38 - local_d8c) - 1));
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
  }
  for (local_da4 = 0;
      y = (Expression *)CONCAT44(in_stack_ffffffffffffe824,in_stack_ffffffffffffe820),
      local_da4 < local_38; local_da4 = local_da4 + 1) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_340,(ulong)local_da4);
    cnn::expr::Expression::Expression
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_360,(ulong)local_da4);
    cnn::expr::Expression::Expression
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
    local_dc0 = 2;
    local_dc8 = local_de8;
    cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_380,(ulong)local_da4);
    cnn::expr::Expression::operator=
              ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
  }
  local_dec = 0;
  do {
    if (local_38 <= local_dec) {
      cnn::expr::sum<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe7e8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 *)in_stack_ffffffffffffe800);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_ffffffffffffe800);
      EVar13._8_8_ = extraout_RDX;
      EVar13.pg = in_RDI;
      return EVar13;
    }
    cnn::RNNBuilder::new_graph(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
    dVar11 = 0.0;
    local_e08 = (undefined1  [16])0x0;
    local_df8 = 0;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x390fb5);
    cnn::RNNBuilder::start_new_sequence
              ((RNNBuilder *)in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_ffffffffffffe800);
    uVar14 = (undefined4)((ulong)y >> 0x20);
    if ((local_31 & 1) == 0) {
      local_1060.d[5] = 0;
      local_109c = HIDDEN_DIM;
      local_1098 = &local_109c;
      local_1090 = 1;
      x_00._M_len._0_4_ = (int)y;
      x_00._M_array = (iterator)in_stack_ffffffffffffe818;
      x_00._M_len._4_4_ = uVar14;
      cnn::Dim::Dim(in_stack_ffffffffffffe810,x_00);
      cnn::expr::zeroes((ComputationGraph *)in_stack_ffffffffffffe808,
                        (Dim *)in_stack_ffffffffffffe800);
      do {
        if (6 < (int)local_1060.d[5]) break;
        cnn::expr::Expression::Expression((Expression *)0x39178f);
        std::allocator<cnn::expr::Expression>::allocator
                  ((allocator<cnn::expr::Expression> *)0x3917af);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
                   (allocator_type *)in_stack_ffffffffffffe800);
        std::allocator<cnn::expr::Expression>::~allocator
                  ((allocator<cnn::expr::Expression> *)0x3917d5);
        for (local_10d0 = 0; local_10d0 < local_38; local_10d0 = local_10d0 + 1) {
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_380,(ulong)local_10d0);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          cnn::expr::operator+((Expression *)in_stack_ffffffffffffe828,y);
          dVar11 = cnn::expr::tanh(local_10f0,dVar11);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_10c8,(ulong)local_10d0);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
        cnn::expr::
        concatenate_cols<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe7e8);
        cnn::expr::
        concatenate<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe7e8);
        cnn::expr::softmax((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        y = &local_10b0;
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_380,(ulong)local_dec);
        in_stack_ffffffffffffe828 = (Tensor *)local_11d0;
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_11a8 = (float *)0x2;
        local_11d0._32_8_ = in_stack_ffffffffffffe828;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        cnn::RNNBuilder::add_input
                  ((RNNBuilder *)in_stack_ffffffffffffe808,(Expression *)in_stack_ffffffffffffe800);
        in_stack_ffffffffffffe810 = &local_1060;
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        in_stack_ffffffffffffe818 = local_1240;
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_1208 = 3;
        local_1210 = in_stack_ffffffffffffe818;
        cnn::expr::affine_transform
                  ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
        dVar11 = cnn::expr::tanh(local_11f0,dVar11);
        cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
        if (in_stack_00000008 == (double *)0x0) {
LAB_00391e31:
          local_129c = 0;
        }
        else {
          in_stack_ffffffffffffe808 =
               cnn::ComputationGraph::incremental_forward((ComputationGraph *)0x391b46);
          cnn::as_vector(in_stack_ffffffffffffe828);
          dVar11 = -9e+99;
          local_1270 = -9e+99;
          local_1274 = -1;
          local_1278 = 0;
          while( true ) {
            in_stack_ffffffffffffe800 = (Parameters *)(long)local_1278;
            pPVar8 = (Parameters *)std::vector<float,_std::allocator<float>_>::size(&local_1268);
            if (pPVar8 <= in_stack_ffffffffffffe800) break;
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_1268,(long)local_1278);
            dVar11 = (double)*pvVar6;
            if (local_1270 < dVar11) {
              pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                 (&local_1268,(long)local_1278);
              dVar11 = (double)*pvVar6;
              local_1274 = local_1278;
              local_1270 = dVar11;
            }
            local_1278 = local_1278 + 1;
          }
          in_stack_ffffffffffffe7f8 =
               (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               (long)(int)local_1060.d[5];
          pvVar3 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](local_28,(ulong)local_dec);
          pvVar9 = (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   std::vector<int,_std::allocator<int>_>::size(pvVar3);
          if (in_stack_ffffffffffffe7f8 < pvVar9) {
            pvVar3 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](local_28,(ulong)local_dec);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar3,(long)(int)local_1060.d[5]);
            if (*pvVar7 == local_1274) {
              dVar11 = *in_stack_00000008 + 1.0;
              *in_stack_00000008 = dVar11;
            }
          }
          in_stack_ffffffffffffe7f0 = (RNNBuilder *)(long)(int)local_1060.d[5];
          pvVar3 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](local_28,(ulong)local_dec);
          pRVar10 = (RNNBuilder *)std::vector<int,_std::allocator<int>_>::size(pvVar3);
          if (in_stack_ffffffffffffe7f0 < pRVar10) {
            pvVar3 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](local_28,(ulong)local_dec);
            std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)(int)local_1060.d[5]);
            cnn::expr::pickneglogsoftmax
                      ((Expression *)in_stack_ffffffffffffe828,(uint)((ulong)y >> 0x20));
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                      ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       in_stack_ffffffffffffe7f0,(value_type *)in_stack_ffffffffffffe7e8);
          }
          else {
            in_stack_ffffffffffffe7e8 =
                 (ComputationGraph *)
                 std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_28,(ulong)local_dec);
            pvVar3 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](local_28,(ulong)local_dec);
            sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7e8,sVar2 - 1);
            cnn::expr::pickneglogsoftmax
                      ((Expression *)in_stack_ffffffffffffe828,(uint)((ulong)y >> 0x20));
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                      ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       in_stack_ffffffffffffe7f0,(value_type *)in_stack_ffffffffffffe7e8);
          }
          local_1060.d[5] = local_1060.d[5] + 1;
          if (local_1274 == endlabel) {
            local_129c = 0x29;
          }
          else {
            local_129c = 0;
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe800);
          if (local_129c == 0) goto LAB_00391e31;
        }
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe800);
      } while (local_129c == 0);
      if (in_stack_00000010 != (int *)0x0) {
        *in_stack_00000010 = local_1060.d[5] + *in_stack_00000010;
      }
      if (in_stack_00000018 != (int *)0x0) {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_28,(ulong)local_dec);
        sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
        *in_stack_00000018 = *in_stack_00000018 + (int)sVar2;
      }
    }
    else {
      local_e0c = 0;
      local_e5c = HIDDEN_DIM;
      local_e58 = &local_e5c;
      local_e50 = 1;
      x._M_len._0_4_ = (int)y;
      x._M_array = (iterator)in_stack_ffffffffffffe818;
      x._M_len._4_4_ = uVar14;
      cnn::Dim::Dim(in_stack_ffffffffffffe810,x);
      cnn::expr::zeroes((ComputationGraph *)in_stack_ffffffffffffe808,
                        (Dim *)in_stack_ffffffffffffe800);
      while( true ) {
        uVar5 = (ulong)local_e0c;
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_28,(ulong)local_dec);
        sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
        if (sVar2 <= uVar5) break;
        cnn::expr::Expression::Expression((Expression *)0x3910bd);
        std::allocator<cnn::expr::Expression>::allocator
                  ((allocator<cnn::expr::Expression> *)0x3910e3);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe810,(size_type)in_stack_ffffffffffffe808,
                   (allocator_type *)in_stack_ffffffffffffe800);
        std::allocator<cnn::expr::Expression>::~allocator
                  ((allocator<cnn::expr::Expression> *)0x39110f);
        for (local_e90 = 0; local_e90 < local_38; local_e90 = local_e90 + 1) {
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_380,(ulong)local_e90);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          cnn::expr::operator+((Expression *)in_stack_ffffffffffffe828,y);
          dVar11 = cnn::expr::tanh(local_eb0,dVar11);
          cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                    (&local_e88,(ulong)local_e90);
          cnn::expr::Expression::operator=
                    ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8
                    );
        }
        cnn::expr::
        concatenate_cols<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe7e8);
        cnn::expr::
        concatenate<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe7e8);
        cnn::expr::softmax((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
        cnn::expr::transpose((Expression *)in_stack_ffffffffffffe828);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  (&local_380,(ulong)local_dec);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_f68 = 2;
        local_f70 = local_f90;
        cnn::expr::concatenate((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8)
        ;
        cnn::RNNBuilder::add_input
                  ((RNNBuilder *)in_stack_ffffffffffffe808,(Expression *)in_stack_ffffffffffffe800);
        cnn::expr::Expression::operator=
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        cnn::expr::Expression::Expression
                  ((Expression *)in_stack_ffffffffffffe7f0,(Expression *)in_stack_ffffffffffffe7e8);
        local_fc8 = 3;
        local_fd0 = local_1000;
        cnn::expr::affine_transform
                  ((initializer_list<cnn::expr::Expression> *)in_stack_ffffffffffffe7e8);
        dVar11 = cnn::expr::tanh(local_fb0,dVar11);
        cnn::expr::operator*((Expression *)in_stack_ffffffffffffe828,y);
        if (in_stack_00000008 != (double *)0x0) {
          cnn::ComputationGraph::incremental_forward((ComputationGraph *)0x3914b2);
          cnn::as_vector(in_stack_ffffffffffffe828);
          dVar11 = -9e+99;
          local_1030 = -9e+99;
          local_1034 = -1;
          for (local_1038 = 0; uVar5 = (ulong)local_1038,
              sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_1028), uVar5 < sVar2;
              local_1038 = local_1038 + 1) {
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_1028,(long)local_1038);
            dVar11 = (double)*pvVar6;
            if (local_1030 < dVar11) {
              pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                 (&local_1028,(long)local_1038);
              dVar11 = (double)*pvVar6;
              local_1034 = local_1038;
              local_1030 = dVar11;
            }
          }
          pvVar3 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](local_28,(ulong)local_dec);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)local_e0c);
          if (*pvVar7 == local_1034) {
            dVar11 = *in_stack_00000008 + 1.0;
            *in_stack_00000008 = dVar11;
          }
          pvVar3 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](local_28,(ulong)local_dec);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)local_e0c);
          cnn::expr::pickneglogsoftmax
                    ((Expression *)in_stack_ffffffffffffe828,(uint)((ulong)y >> 0x20));
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     in_stack_ffffffffffffe7f0,(value_type *)in_stack_ffffffffffffe7e8);
          local_e0c = local_e0c + 1;
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe800);
        }
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   in_stack_ffffffffffffe800);
      }
      if (in_stack_00000010 != (int *)0x0) {
        *in_stack_00000010 = local_e0c + *in_stack_00000010;
      }
      if (in_stack_00000018 != (int *)0x0) {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_28,(ulong)local_dec);
        sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
        *in_stack_00000018 = *in_stack_00000018 + (int)sVar2;
      }
    }
    local_dec = local_dec + 1;
  } while( true );
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    
    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 7) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }